

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O3

void xemmai::t_signature<long,int>::f_check<0ul,1ul>(ulong *a_stack)

{
  ulong uVar1;
  
  uVar1 = *a_stack;
  if ((uVar1 == 3) ||
     ((((2 < uVar1 && (uVar1 != 4)) && (*(long *)(*(long *)(uVar1 + 0x40) + 8) != 0)) &&
      (*(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) == &v__type_id<long>)))) {
    uVar1 = a_stack[2];
    if ((uVar1 == 3) ||
       (((2 < uVar1 && (uVar1 != 4)) &&
        ((*(long *)(*(long *)(uVar1 + 0x40) + 8) != 0 &&
         (*(undefined8 **)(*(long *)(*(long *)(uVar1 + 0x40) + 0x10) + 8) == &v__type_id<long>))))))
    {
      return;
    }
  }
  else {
    f_check<0ul,1ul>();
  }
  f_check<0ul,1ul>();
}

Assistant:

static void f_check(t_pvalue* a_stack, std::index_sequence<A_i...>)
	{
		(xemmai::f_check<T_an>(a_stack[A_i], t_cs<L'a', L'r', L'g', L'u', L'm', L'e', L'n', L't'>() + typename t_n2s<A_i>::t()), ...);
	}